

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Socket::Poll::Private::clear(Private *this)

{
  code *pcVar1;
  int iVar2;
  epoll_event ev;
  
  ::close(this->fd);
  iVar2 = epoll_create1(0x80000);
  this->fd = iVar2;
  HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::clear(&this->sockets);
  HashMap<Socket_*,_unsigned_int>::clear(&this->selectedSockets);
  ev.events = 0x2011;
  ev.data.ptr = (void *)0x0;
  iVar2 = epoll_ctl(this->fd,1,this->eventFd,(epoll_event *)&ev);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Socket/Socket.cpp"
                          ,0x4ea,"epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void Socket::Poll::Private::clear()
{
  ::close(fd);
  fd = epoll_create1(EPOLL_CLOEXEC);
  sockets.clear();
  selectedSockets.clear();
  epoll_event ev;
  ev.events = EPOLLIN | EPOLLRDHUP | EPOLLHUP;
  ev.data.ptr = NULL;
  VERIFY(epoll_ctl(fd, EPOLL_CTL_ADD, eventFd, &ev) == 0);
}